

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

void enet_protocol_notify_connect(ENetHost *host,ENetPeer *peer,ENetEvent *event)

{
  host->recalculateBandwidthLimits = 1;
  if (event != (ENetEvent *)0x0) {
    enet_peer_on_connect(peer);
    peer->state = ENET_PEER_STATE_CONNECTED;
    event->type = ENET_EVENT_TYPE_CONNECT;
    event->peer = peer;
    event->data = peer->eventData;
    return;
  }
  enet_protocol_dispatch_state
            (host,peer,
             (peer->state == ENET_PEER_STATE_CONNECTING) + ENET_PEER_STATE_CONNECTION_PENDING);
  return;
}

Assistant:

static void
enet_protocol_notify_connect (ENetHost * host, ENetPeer * peer, ENetEvent * event)
{
    host -> recalculateBandwidthLimits = 1;

    if (event != NULL)
    {
        enet_protocol_change_state (host, peer, ENET_PEER_STATE_CONNECTED);

        event -> type = ENET_EVENT_TYPE_CONNECT;
        event -> peer = peer;
        event -> data = peer -> eventData;
    }
    else 
        enet_protocol_dispatch_state (host, peer, peer -> state == ENET_PEER_STATE_CONNECTING ? ENET_PEER_STATE_CONNECTION_SUCCEEDED : ENET_PEER_STATE_CONNECTION_PENDING);
}